

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  pointer ppcVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  pointer ppcVar4;
  
  ppcVar4 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppcVar4 == ppcVar1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    bVar2 = cmFileLock::IsLocked(*ppcVar4,filename);
    if (bVar2) break;
    ppcVar4 = ppcVar4 + 1;
  }
  cVar3 = cmFileLock::Release(*ppcVar4);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
  const std::string& filename)
{
  for (auto& lock : this->Locks) {
    if (lock->IsLocked(filename)) {
      return lock->Release();
    }
  }
  return cmFileLockResult::MakeOk();
}